

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O2

void anon_unknown.dwarf_98c09::testFloatToHalf(uint floatVal,uint halfVal)

{
  half hVar1;
  ushort uVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"floatToHalf (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)floatVal);
  poVar3 = std::operator<<(poVar3,") == ");
  hVar1._h = Imf_3_4::floatToHalf((float)floatVal);
  poVar3 = (ostream *)::operator<<(poVar3,hVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = Imf_3_4::floatToHalf((float)floatVal);
  if (uVar2 == halfVal) {
    return;
  }
  __assert_fail("floatToHalf (u.f).bits () == halfVal",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x45,"void (anonymous namespace)::testFloatToHalf(unsigned int, unsigned int)");
}

Assistant:

void
testFloatToHalf (unsigned int floatVal, unsigned int halfVal)
{
    union
    {
        unsigned int ui;
        float        f;
    } u;
    u.ui = floatVal;
    cout << "floatToHalf (" << u.f << ") == " << floatToHalf (u.f) << endl;
    assert (floatToHalf (u.f).bits () == halfVal);
}